

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::retranslateStrings(QColorDialogPrivate *this)

{
  QLabel *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff68;
  int n;
  QString *text;
  char *in_stack_ffffffffffffff78;
  QAbstractButton *this_00;
  QLabel *this_01;
  QColorShower *this_02;
  
  n = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  this_02 = *(QColorShower **)(in_FS_OFFSET + 0x28);
  if ((*(byte *)((long)(in_RDI + 0x11) + 0x20) & 1) == 0) {
    if ((in_RDI[0x15].super_QFrame.super_QWidget.field_0x1c & 1) == 0) {
      text = *(QString **)((long)(in_RDI + 0x13) + 0x20);
      this_01 = in_RDI;
      QColorDialog::tr(in_stack_ffffffffffffff78,(char *)text,n);
      QLabel::setText(this_01,(QString *)in_RDI);
      QString::~QString((QString *)0x73942f);
      this_00 = *(QAbstractButton **)(in_RDI + 0x14);
      QColorDialog::tr((char *)this_00,(char *)text,n);
      QLabel::setText(this_01,(QString *)in_RDI);
      QString::~QString((QString *)0x739473);
      QColorDialog::tr((char *)this_00,(char *)text,n);
      QAbstractButton::setText(this_00,text);
      QString::~QString((QString *)0x7394b7);
      if (*(Data **)&in_RDI[0x15].super_QFrame.super_QWidget != (Data *)0x0) {
        QColorDialog::tr((char *)this_00,(char *)text,
                         (int)((ulong)*(Data **)&in_RDI[0x15].super_QFrame.super_QWidget >> 0x20));
        QAbstractButton::setText(this_00,text);
        QString::~QString((QString *)0x739508);
      }
    }
    QtPrivate::QColorShower::retranslateStrings(this_02);
  }
  if (*(QColorShower **)(in_FS_OFFSET + 0x28) != this_02) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorDialogPrivate::retranslateStrings()
{
    if (nativeDialogInUse)
        return;

    if (!smallDisplay) {
        lblBasicColors->setText(QColorDialog::tr("&Basic colors"));
        lblCustomColors->setText(QColorDialog::tr("&Custom colors"));
        addCusBt->setText(QColorDialog::tr("&Add to Custom Colors"));
#if !defined(QT_SMALL_COLORDIALOG)
        if (eyeDropperButton)
            eyeDropperButton->setText(QColorDialog::tr("&Pick Screen Color"));
#endif
    }

    cs->retranslateStrings();
}